

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

Literals * __thiscall
anon_unknown.dwarf_5f52c::CtorEvalExternalInterface::callTable
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type result,EvallingModuleRunner *instance)

{
  pointer puVar1;
  ElementSegment *pEVar2;
  Literals *__return_storage_ptr___00;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  string *psVar6;
  ulong uVar7;
  long lVar8;
  pointer puVar9;
  char *pcVar10;
  Name name;
  Name NVar11;
  Name NVar12;
  SmallVector<wasm::Literal,_1UL> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  uintptr_t local_90;
  Literals *local_88;
  CtorEvalExternalInterface *local_80;
  string local_78;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  NVar11.super_IString.str._M_str = tableName.super_IString.str._M_len;
  NVar11.super_IString.str._M_len = (size_t)this->wasm;
  local_90 = sig.id;
  local_88 = __return_storage_ptr__;
  lVar5 = wasm::Module::getTableOrNull(NVar11);
  if (lVar5 == 0) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"callTable on non-existing table","");
    *(string **)psVar6 = psVar6 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar6,local_d0,local_d0 + local_c8);
    __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  puVar9 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = this;
  if (puVar9 != puVar1) {
    local_58 = (char *)0x0;
    pcVar10 = (char *)0x0;
    do {
      pEVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)(pEVar2 + 0x20) == tableName.super_IString.str._M_str) {
        if (**(char **)(pEVar2 + 0x28) == '\x0e') {
          uVar4 = wasm::Literal::getInteger();
          uVar7 = (ulong)uVar4;
          if (index.addr < uVar7) goto LAB_00128c32;
          pEVar2 = (puVar9->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          lVar5 = *(long *)(pEVar2 + 0x38);
          lVar8 = *(long *)(pEVar2 + 0x40) - lVar5;
        }
        else {
          if (**(char **)(pEVar2 + 0x28) != '\n') {
            wasm::handle_unreachable
                      ("invalid expr type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                       ,0x145);
          }
          lVar5 = *(long *)(pEVar2 + 0x38);
          lVar8 = *(long *)(pEVar2 + 0x40) - lVar5;
          uVar7 = 0;
        }
        if (index.addr < (lVar8 >> 3) + uVar7) {
          pcVar10 = *(char **)(lVar5 + (index.addr - uVar7) * 8);
          if (*pcVar10 != '+') {
            psVar6 = (string *)__cxa_allocate_exception(0x20);
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"callTable on uninitialized entry","");
            *(string **)psVar6 = psVar6 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar6,local_b0,local_b0 + local_a8);
            __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                        FailToEvalException::~FailToEvalException);
          }
          local_58 = *(char **)(pcVar10 + 0x10);
          pcVar10 = *(char **)(pcVar10 + 0x18);
        }
      }
LAB_00128c32:
      pcVar3 = local_58;
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
    if (pcVar10 != (char *)0x0) {
      NVar12.super_IString.str._M_str = local_58;
      NVar12.super_IString.str._M_len = (size_t)local_80->wasm;
      lVar5 = wasm::Module::getFunction(NVar12);
      __return_storage_ptr___00 = local_88;
      if (*(uintptr_t *)(lVar5 + 0x38) != local_90) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"callTable signature mismatch: ","");
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar10,local_58 + (long)pcVar10);
        std::operator+(&local_110,&local_50,&local_78);
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  (psVar6,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      if (*(long *)(lVar5 + 0x20) == 0) {
        wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
                  (&local_168,&arguments->super_SmallVector<wasm::Literal,_1UL>);
        name.super_IString.str._M_str = pcVar10;
        name.super_IString.str._M_len = (size_t)pcVar3;
        wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
                  (__return_storage_ptr___00,
                   &instance->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>,
                   name,(Literals *)&local_168);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_168.flexible);
        wasm::Literal::~Literal(local_168.fixed._M_elems);
        return __return_storage_ptr___00;
      }
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"callTable on imported function: ","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,pcVar10,local_58 + (long)pcVar10);
      std::operator+(&local_f0,&local_50,&local_78);
      *(string **)psVar6 = psVar6 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar6,local_f0._M_dataplus._M_p,
                 local_f0._M_dataplus._M_p + local_f0._M_string_length);
      __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
  }
  psVar6 = (string *)__cxa_allocate_exception(0x20);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"callTable on index not found in static segments: ","");
  std::__cxx11::to_string(&local_78,index.addr);
  std::operator+(&local_130,&local_50,&local_78);
  *(string **)psVar6 = psVar6 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            (psVar6,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type result,
                     EvallingModuleRunner& instance) override {

    std::unordered_map<wasm::Name, std::vector<wasm::Name>>::iterator it;

    auto* table = wasm->getTableOrNull(tableName);
    if (!table) {
      throw FailToEvalException("callTable on non-existing table");
    }

    // Look through the segments and find the function. Segments can overlap,
    // so we want the last one.
    Name targetFunc;
    for (auto& segment : wasm->elementSegments) {
      if (segment->table != tableName) {
        continue;
      }

      Index start;
      // look for the index in this segment. if it has a constant offset, we
      // look in the proper range. if it instead gets a global, we rely on the
      // fact that when not dynamically linking then the table is loaded at
      // offset 0.
      if (auto* c = segment->offset->dynCast<Const>()) {
        start = c->value.getInteger();
      } else if (segment->offset->is<GlobalGet>()) {
        start = 0;
      } else {
        // wasm spec only allows const and global.get there
        WASM_UNREACHABLE("invalid expr type");
      }
      auto end = start + segment->data.size();
      if (start <= index && index < end) {
        auto entry = segment->data[index - start];
        if (auto* get = entry->dynCast<RefFunc>()) {
          targetFunc = get->func;
        } else {
          throw FailToEvalException(
            std::string("callTable on uninitialized entry"));
        }
      }
    }

    if (!targetFunc.is()) {
      throw FailToEvalException(
        std::string("callTable on index not found in static segments: ") +
        std::to_string(index));
    }

    // If this is one of our functions, we can call it; if it was
    // imported, fail.
    auto* func = wasm->getFunction(targetFunc);
    if (func->type != sig) {
      throw FailToEvalException(std::string("callTable signature mismatch: ") +
                                targetFunc.toString());
    }
    if (!func->imported()) {
      return instance.callFunction(targetFunc, arguments);
    } else {
      throw FailToEvalException(
        std::string("callTable on imported function: ") +
        targetFunc.toString());
    }
  }